

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_clear_fd(intptr_t fd,uint8_t is_open)

{
  undefined1 uVar1;
  char cVar2;
  undefined1 uVar3;
  long lVar4;
  long lVar5;
  long *__ptr;
  void *__ptr_00;
  void *arg2;
  long lVar6;
  undefined8 uVar7;
  code *pcVar8;
  fio_packet_s *pfVar9;
  fio_data_s *pfVar10;
  int extraout_EAX;
  int iVar11;
  int extraout_EAX_00;
  undefined8 *puVar12;
  fio_packet_s *tmp;
  fio_packet_s *packet;
  long lVar13;
  fio_uuid_links__ordered_s_ *pos;
  long *plVar14;
  fio_lock_i ret;
  
  lVar13 = fd * 0xa8;
  fio_lock((fio_lock_i *)((long)fio_data + lVar13 + 0x6e));
  pfVar10 = fio_data;
  puVar12 = (undefined8 *)((long)fio_data + lVar13 + 0x40);
  lVar4 = *(long *)((long)fio_data + lVar13 + 0xb8);
  lVar5 = *(long *)((long)fio_data + lVar13 + 200);
  __ptr = *(long **)((long)fio_data + lVar13 + 0xd0);
  __ptr_00 = *(void **)((long)fio_data + lVar13 + 0xd8);
  packet = (fio_packet_s *)*puVar12;
  arg2 = *(void **)((long)fio_data + lVar13 + 0x58);
  lVar6 = *(long *)((long)fio_data + lVar13 + 0xa8);
  uVar7 = *(undefined8 *)((long)fio_data + lVar13 + 0xb0);
  uVar1 = *(undefined1 *)((long)fio_data + lVar13 + 0x6c);
  cVar2 = *(char *)((long)fio_data + lVar13 + 0x6d);
  uVar3 = *(undefined1 *)((long)fio_data + lVar13 + 0x6e);
  *puVar12 = 0;
  *(undefined8 **)((long)pfVar10 + lVar13 + 0x48) = puVar12;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0x68) = 0;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0x60) = 0;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0x50) = 0;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0x58) = 0;
  *(undefined1 *)((long)pfVar10 + lVar13 + 0x6c) = uVar1;
  *(char *)((long)pfVar10 + lVar13 + 0x6d) = cVar2 + '\x01';
  *(undefined1 *)((long)pfVar10 + lVar13 + 0x6e) = uVar3;
  *(uint8_t *)((long)pfVar10 + lVar13 + 0x6f) = is_open;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0xa0) = 0;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0x90) = 0;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0x98) = 0;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0x80) = 0;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0x88) = 0;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0x70) = 0;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0x78) = 0;
  *(fio_rw_hook_s **)((long)pfVar10 + lVar13 + 0xa8) = &FIO_DEFAULT_RW_HOOKS;
  *(undefined8 *)((long)pfVar10 + lVar13 + 0xe0) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xd0) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xd4) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xd8) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xdc) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xc0) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xc4) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 200) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xcc) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xb0) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xb4) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xb8) = 0;
  *(undefined4 *)((long)pfVar10 + lVar13 + 0xbc) = 0;
  LOCK();
  *(undefined1 *)((long)pfVar10 + lVar13 + 0x6e) = 0;
  UNLOCK();
  if ((lVar6 != 0) && (pcVar8 = *(code **)(lVar6 + 0x20), pcVar8 != (code *)0x0)) {
    (*pcVar8)(uVar7);
  }
  while (packet != (fio_packet_s *)0x0) {
    pfVar9 = packet->next;
    fio_packet_free(packet);
    packet = pfVar9;
  }
  if (lVar4 != 0) {
    for (plVar14 = __ptr; (plVar14 != (long *)0x0 && (plVar14 < __ptr + lVar5 * 2));
        plVar14 = plVar14 + 2) {
      if (*plVar14 != 0) {
        (*(code *)plVar14[1])();
      }
    }
  }
  free(__ptr_00);
  free(__ptr);
  iVar11 = extraout_EAX;
  if ((arg2 != (void *)0x0) && (*(long *)((long)arg2 + 0x18) != 0)) {
    iVar11 = fio_defer(deferred_on_close,
                       (void *)((ulong)*(byte *)((long)fio_data + lVar13 + 0x6d) | fd << 8),arg2);
  }
  if (is_open != '\0') {
    fio_max_fd_min((uint32_t)fd);
    return extraout_EAX_00;
  }
  return iVar11;
}

Assistant:

static inline int fio_clear_fd(intptr_t fd, uint8_t is_open) {
  fio_packet_s *packet;
  fio_protocol_s *protocol;
  fio_rw_hook_s *rw_hooks;
  void *rw_udata;
  fio_uuid_links_s links;
  fio_lock(&(fd_data(fd).sock_lock));
  links = fd_data(fd).links;
  packet = fd_data(fd).packet;
  protocol = fd_data(fd).protocol;
  rw_hooks = fd_data(fd).rw_hooks;
  rw_udata = fd_data(fd).rw_udata;
  fd_data(fd) = (fio_fd_data_s){
      .open = is_open,
      .sock_lock = fd_data(fd).sock_lock,
      .protocol_lock = fd_data(fd).protocol_lock,
      .rw_hooks = (fio_rw_hook_s *)&FIO_DEFAULT_RW_HOOKS,
      .counter = fd_data(fd).counter + 1,
      .packet_last = &fd_data(fd).packet,
  };
  fio_unlock(&(fd_data(fd).sock_lock));
  if (rw_hooks && rw_hooks->cleanup)
    rw_hooks->cleanup(rw_udata);
  while (packet) {
    fio_packet_s *tmp = packet;
    packet = packet->next;
    fio_packet_free(tmp);
  }
  if (fio_uuid_links_count(&links)) {
    FIO_SET_FOR_LOOP(&links, pos) {
      if (pos->hash)
        pos->obj((void *)pos->hash);
    }
  }
  fio_uuid_links_free(&links);
  if (protocol && protocol->on_close) {
    fio_defer(deferred_on_close, (void *)fd2uuid(fd), protocol);
  }
  if (is_open)
    fio_max_fd_min(fd);
  return 0;
}